

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

void __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_4,_int>_>::setIdentity
          (PermutationBase<Eigen::PermutationMatrix<_1,_4,_int>_> *this,Index newSize)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if ((uint)newSize < 5) {
    *(ulong *)(this + 0x10) = (ulong)(uint)newSize;
    auVar1 = _DAT_00144040;
    if (newSize != 0) {
      lVar2 = (ulong)(uint)newSize - 1;
      auVar4._8_4_ = (int)lVar2;
      auVar4._0_8_ = lVar2;
      auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
      uVar3 = 0;
      auVar4 = auVar4 ^ _DAT_00144040;
      auVar5 = _DAT_00144030;
      do {
        auVar6 = auVar5 ^ auVar1;
        if ((bool)(~(auVar6._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar6._0_4_ ||
                    auVar4._4_4_ < auVar6._4_4_) & 1)) {
          *(int *)(this + uVar3 * 4) = (int)uVar3;
        }
        if ((auVar6._12_4_ != auVar4._12_4_ || auVar6._8_4_ <= auVar4._8_4_) &&
            auVar6._12_4_ <= auVar4._12_4_) {
          *(int *)(this + uVar3 * 4 + 4) = (int)uVar3 + 1;
        }
        uVar3 = uVar3 + 2;
        lVar2 = auVar5._8_8_;
        auVar5._0_8_ = auVar5._0_8_ + 2;
        auVar5._8_8_ = lVar2 + 2;
      } while ((newSize + 1U & 0xe) != uVar3);
    }
    return;
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x10c,
                "void Eigen::PlainObjectBase<Eigen::Matrix<int, -1, 1, 0, 4, 1>>::resize(Index) [Derived = Eigen::Matrix<int, -1, 1, 0, 4, 1>]"
               );
}

Assistant:

inline void resize(Index size)
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(PlainObjectBase)
      eigen_assert(((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0);
      #ifdef EIGEN_INITIALIZE_COEFFS
        bool size_changed = size != this->size();
      #endif
      if(RowsAtCompileTime == 1)
        m_storage.resize(size, 1, size);
      else
        m_storage.resize(size, size, 1);
      #ifdef EIGEN_INITIALIZE_COEFFS
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #endif
    }